

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void handle_delete(mg_connection *nc,mg_serve_http_opts *opts,char *path)

{
  int iVar1;
  undefined1 local_b0 [8];
  cs_stat_t st;
  char *path_local;
  mg_serve_http_opts *opts_local;
  mg_connection *nc_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)path;
  iVar1 = mg_stat(path,(cs_stat_t *)local_b0);
  if (iVar1 == 0) {
    if (((uint)st.st_nlink & 0xf000) == 0x4000) {
      remove_directory(opts,(char *)st.__glibc_reserved[2]);
      send_http_error(nc,0xcc,(char *)0x0);
    }
    else {
      iVar1 = remove((char *)st.__glibc_reserved[2]);
      if (iVar1 == 0) {
        send_http_error(nc,0xcc,(char *)0x0);
      }
      else {
        send_http_error(nc,0x1a7,(char *)0x0);
      }
    }
  }
  else {
    send_http_error(nc,0x194,(char *)0x0);
  }
  return;
}

Assistant:

static void handle_delete(struct mg_connection *nc,
                          const struct mg_serve_http_opts *opts,
                          const char *path) {
    cs_stat_t st;
    if (mg_stat(path, &st) != 0) {
        send_http_error(nc, 404, NULL);
    } else if (S_ISDIR(st.st_mode)) {
        remove_directory(opts, path);
        send_http_error(nc, 204, NULL);
    } else if (remove(path) == 0) {
        send_http_error(nc, 204, NULL);
    } else {
        send_http_error(nc, 423, NULL);
    }
}